

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void * AllocUnitsRare(CPpmd7 *p,uint indx)

{
  uint uVar1;
  Byte *local_38;
  UInt32 numBytes;
  void *retVal;
  uint i;
  uint indx_local;
  CPpmd7 *p_local;
  
  retVal._0_4_ = indx;
  if ((p->GlueCount == 0) && (GlueFreeBlocks(p), p->FreeList[indx] != 0)) {
    p_local = (CPpmd7 *)RemoveNode(p,indx);
  }
  else {
    do {
      retVal._0_4_ = (uint)retVal + 1;
      if ((uint)retVal == 0x26) {
        uVar1 = (uint)p->Indx2Units[indx] * 0xc;
        p->GlueCount = p->GlueCount - 1;
        if (uVar1 < (uint)((int)p->UnitsStart - (int)p->Text)) {
          local_38 = p->UnitsStart + -(ulong)uVar1;
          p->UnitsStart = local_38;
        }
        else {
          local_38 = (Byte *)0x0;
        }
        return local_38;
      }
    } while (p->FreeList[(uint)retVal] == 0);
    p_local = (CPpmd7 *)RemoveNode(p,(uint)retVal);
    SplitBlock(p,p_local,(uint)retVal,indx);
  }
  return p_local;
}

Assistant:

static void *AllocUnitsRare(CPpmd7 *p, unsigned indx)
{
  unsigned i;
  void *retVal;
  if (p->GlueCount == 0)
  {
    GlueFreeBlocks(p);
    if (p->FreeList[indx] != 0)
      return RemoveNode(p, indx);
  }
  i = indx;
  do
  {
    if (++i == PPMD_NUM_INDEXES)
    {
      UInt32 numBytes = U2B(I2U(indx));
      p->GlueCount--;
      return ((UInt32)(p->UnitsStart - p->Text) > numBytes) ? (p->UnitsStart -= numBytes) : (NULL);
    }
  }
  while (p->FreeList[i] == 0);
  retVal = RemoveNode(p, i);
  SplitBlock(p, retVal, i, indx);
  return retVal;
}